

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldFullName_Test::TestBody
          (DescriptorTest_FieldFullName_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper AStack_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (((this->super_DescriptorTest).foo_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage.foo\"","foo_->full_name()",(char (*) [16])"TestMessage.foo",
             &local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x459,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).bar_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage.bar\"","bar_->full_name()",(char (*) [16])"TestMessage.bar",
             &local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45a,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).baz_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage.baz\"","baz_->full_name()",(char (*) [16])"TestMessage.baz",
             &local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45b,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).moo_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"TestMessage.moo\"","moo_->full_name()",(char (*) [16])"TestMessage.moo",
             &local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45c,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).foo2_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[30],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"corge.grault.TestMessage2.foo\"","foo2_->full_name()",
             (char (*) [30])"corge.grault.TestMessage2.foo",&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45e,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).bar2_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[30],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"corge.grault.TestMessage2.bar\"","bar2_->full_name()",
             (char (*) [30])"corge.grault.TestMessage2.bar",&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x45f,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_20._M_str = (((this->super_DescriptorTest).mooo2_)->all_names_).payload_;
  local_20._M_len = (size_t)*(ushort *)(local_20._M_str + 2);
  local_20._M_str = local_20._M_str + ~local_20._M_len;
  testing::internal::CmpHelperEQ<char[31],std::basic_string_view<char,std::char_traits<char>>>
            (local_30,"\"corge.grault.TestMessage2.mooo\"","mooo2_->full_name()",
             (char (*) [31])"corge.grault.TestMessage2.mooo",&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x460,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_20._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldFullName) {
  EXPECT_EQ("TestMessage.foo", foo_->full_name());
  EXPECT_EQ("TestMessage.bar", bar_->full_name());
  EXPECT_EQ("TestMessage.baz", baz_->full_name());
  EXPECT_EQ("TestMessage.moo", moo_->full_name());

  EXPECT_EQ("corge.grault.TestMessage2.foo", foo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.bar", bar2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.mooo", mooo2_->full_name());
}